

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::CommissionerApp::SetTriHostname
          (Error *__return_storage_ptr__,CommissionerApp *this,string *aHostname)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ErrorCode EVar3;
  BbrDataset bbrDataset;
  BbrDataset local_c0;
  ErrorCode local_58 [2];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_c0.mTriHostname._M_dataplus._M_p = (pointer)&local_c0.mTriHostname.field_2;
  local_c0.mTriHostname._M_string_length = 0;
  local_c0.mTriHostname.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_c0.mRegistrarHostname.field_2;
  local_c0.mRegistrarHostname._M_string_length = 0;
  local_c0.mRegistrarHostname.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_c0.mRegistrarIpv6Addr.field_2;
  local_c0.mRegistrarIpv6Addr._M_string_length = 0;
  local_c0.mRegistrarIpv6Addr.field_2._M_local_buf[0] = '\0';
  local_c0.mPresentFlags = 0;
  local_c0.mRegistrarHostname._M_dataplus._M_p = (pointer)paVar1;
  local_c0.mRegistrarIpv6Addr._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_assign((string *)&local_c0);
  local_c0.mPresentFlags = local_c0.mPresentFlags | 0x8000;
  (*((this->mCommissioner).
     super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Commissioner[0x16])(local_58);
  __return_storage_ptr__->mCode = local_58[0];
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_50);
  EVar3 = __return_storage_ptr__->mCode;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (EVar3 == kNone) {
    MergeDataset(&this->mBbrDataset,&local_c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.mRegistrarIpv6Addr._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0.mRegistrarIpv6Addr._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.mRegistrarHostname._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0.mRegistrarHostname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.mTriHostname._M_dataplus._M_p != &local_c0.mTriHostname.field_2) {
    operator_delete(local_c0.mTriHostname._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SetTriHostname(const std::string &aHostname)
{
    Error      error;
    BbrDataset bbrDataset;

    bbrDataset.mTriHostname = aHostname;
    bbrDataset.mPresentFlags |= BbrDataset::kTriHostnameBit;

    SuccessOrExit(error = mCommissioner->SetBbrDataset(bbrDataset));

    MergeDataset(mBbrDataset, bbrDataset);

exit:
    return error;
}